

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O2

void __thiscall
helics::MessageFederateManager::MessageFederateManager
          (MessageFederateManager *this,Core *coreOb,MessageFederate *fed,LocalFederateId fedid,
          bool singleThreaded)

{
  bool enableLocking;
  
  enableLocking = !singleThreaded;
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::shared_guarded_opt(&this->mLocalEndpoints,enableLocking);
  *(undefined8 *)((long)&(this->allCallback).m_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->allCallback).m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->allCallback).m_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->allCallback).m_mutex.super___mutex_base._M_mutex + 8) = 0;
  (this->allCallback).m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->allCallback).m_obj.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->allCallback).m_obj._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->allCallback).m_obj.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->allCallback).m_obj.super__Function_base._M_functor + 8) = 0;
  (this->CurrentTime).internalTimeCode = -0x7fffffffffffffff;
  this->coreObject = coreOb;
  this->mFed = fed;
  (this->fedID).fid = fedid.fid;
  gmlc::libguarded::
  shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  ::shared_guarded_opt(&this->eptData,enableLocking);
  (this->messageOrder).m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->messageOrder).m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->messageOrder).m_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->messageOrder).m_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->messageOrder).m_obj.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->messageOrder).m_mutex.super___mutex_base._M_mutex.__align = 0;
  (this->messageOrder).m_obj.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->messageOrder).m_obj.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->messageOrder).enabled = enableLocking;
  return;
}

Assistant:

MessageFederateManager::MessageFederateManager(Core* coreOb,
                                               MessageFederate* fed,
                                               LocalFederateId fedid,
                                               bool singleThreaded):
    mLocalEndpoints(!singleThreaded), coreObject(coreOb), mFed(fed), fedID(fedid),
    eptData(!singleThreaded), messageOrder(!singleThreaded)
{
}